

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer_shaders.h
# Opt level: O0

char * openglrenderer_vsh_blur(void)

{
  return 
  "#define highp\n#define mediump\n#define lowp\nattribute highp vec2 aV; attribute highp vec2 aT; uniform highp mat4 m; uniform int radius; uniform highp vec4 dims; varying highp vec2 vT; void main() { gl_Position = m * vec4(aV, 0, 1); highp vec2 aw = dims.xy; highp vec2 cw = dims.zw; highp vec2 diff = (aw - cw) / aw; vT = (aT - diff/2.0) * (aw / cw); }"
  ;
}

Assistant:

inline const char *openglrenderer_vsh_blur() { return RENGINE_GLSL(
    attribute highp vec2 aV;
    attribute highp vec2 aT;
    uniform highp mat4 m;
    uniform int radius;
    uniform highp vec4 dims;
    varying highp vec2 vT;
    void main() {
        gl_Position = m * vec4(aV, 0, 1);
        highp vec2 aw = dims.xy;
        highp vec2 cw = dims.zw;
        highp vec2 diff = (aw - cw) / aw;
        vT = (aT - diff/2.0) * (aw / cw);
    }
); }